

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_clear(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQRESULT SVar3;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_ARRAY) {
    SVar3 = 0;
    SQArray::Resize((pSVar2->super_SQObject)._unVal.pArray,0);
  }
  else if (SVar1 == OT_TABLE) {
    SQTable::Clear((pSVar2->super_SQObject)._unVal.pTable);
    SVar3 = 0;
  }
  else {
    sq_throwerror(v,"clear only works on table and array");
    SVar3 = -1;
  }
  return SVar3;
}

Assistant:

SQRESULT sq_clear(HSQUIRRELVM v,SQInteger idx)
{
    SQObject &o=stack_get(v,idx);
    switch(sq_type(o)) {
        case OT_TABLE: _table(o)->Clear();  break;
        case OT_ARRAY: _array(o)->Resize(0); break;
        default:
            return sq_throwerror(v, _SC("clear only works on table and array"));
        break;

    }
    return SQ_OK;
}